

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer.cpp
# Opt level: O3

void __thiscall ncnn::Layer::~Layer(Layer *this)

{
  ~Layer(this);
  operator_delete(this,0xb8);
  return;
}

Assistant:

Layer::~Layer()
{
}